

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O1

bool duckdb::DecimalCastOperation::Finalize<duckdb::DecimalCastData<duckdb::hugeint_t>,false>
               (DecimalCastData<duckdb::hugeint_t> *state)

{
  uint8_t uVar1;
  bool bVar2;
  byte bVar3;
  hugeint_t hStack_28;
  
  if ((state->exponent_type != POSITIVE) &&
     (uVar1 = state->decimal_count - state->scale,
     state->scale <= state->decimal_count && uVar1 != '\0')) {
    state->excessive_decimals = uVar1;
  }
  if ((state->excessive_decimals == '\0') ||
     (bVar2 = TruncateExcessiveDecimals<duckdb::DecimalCastData<duckdb::hugeint_t>,false>(state),
     bVar2)) {
    if (((state->exponent_type == NONE) && (state->round_set == true)) &&
       (state->should_round == true)) {
      hugeint_t::hugeint_t(&hStack_28,1);
      hugeint_t::operator+=(&state->result,&hStack_28);
    }
    bVar3 = state->decimal_count;
    if (bVar3 < state->scale) {
      do {
        hugeint_t::hugeint_t(&hStack_28,10);
        hugeint_t::operator*=(&state->result,&hStack_28);
        bVar3 = bVar3 + 1;
      } while (bVar3 < state->scale);
    }
    bVar2 = hugeint_t::operator<(&state->result,&state->limit);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

static bool Finalize(T &state) {
		if (state.exponent_type != ExponentType::POSITIVE && state.decimal_count > state.scale) {
			//! Did not encounter an exponent, but ALLOW_EXPONENT was on
			state.excessive_decimals = state.decimal_count - state.scale;
		}
		if (state.excessive_decimals && !TruncateExcessiveDecimals<T, NEGATIVE>(state)) {
			return false;
		}
		if (state.exponent_type == ExponentType::NONE && state.round_set && state.should_round) {
			RoundUpResult<T, NEGATIVE>(state);
		}
		//  if we have not gotten exactly "scale" decimals, we need to multiply the result
		//  e.g. if we have a string "1.0" that is cast to a DECIMAL(9,3), the value needs to be 1000
		//  but we have only gotten the value "10" so far, so we multiply by 1000
		for (uint8_t i = state.decimal_count; i < state.scale; i++) {
			state.result *= 10;
		}
		if (NEGATIVE) {
			return state.result > -state.limit;
		} else {
			return state.result < state.limit;
		}
	}